

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PostEmscripten.cpp
# Opt level: O0

void __thiscall
wasm::(anonymous_namespace)::calcSegmentOffsets(wasm::Module&,std::vector<wasm::Address,std::
allocator<wasm::Address>>&)::OffsetSearcher::visitMemoryInit(wasm::MemoryInit__
          (void *this,MemoryInit *curr)

{
  bool bVar1;
  uint64_t a;
  mapped_type *this_00;
  Fatal local_1c0;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true> local_38;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Address>,_true> local_30;
  Binary *local_28;
  Binary *add;
  Const *dest;
  MemoryInit *curr_local;
  OffsetSearcher *this_local;
  
  dest = (Const *)curr;
  curr_local = (MemoryInit *)this;
  add = (Binary *)Expression::dynCast<wasm::Const>(curr->dest);
  if ((add != (Binary *)0x0) ||
     ((local_28 = Expression::dynCast<wasm::Binary>((Expression *)(dest->value).type.id),
      local_28 != (Binary *)0x0 &&
      (add = (Binary *)Expression::dynCast<wasm::Const>(local_28->left), add != (Binary *)0x0)))) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
         ::find(*(unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
                  **)((long)this + 0xd8),(key_type *)&dest->value);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
         ::end(*(unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
                 **)((long)this + 0xd8));
    bVar1 = std::__detail::operator!=(&local_30,&local_38);
    if (bVar1) {
      Fatal::Fatal(&local_1c0);
      Fatal::operator<<(&local_1c0,
                        (char (*) [64])
                        "Cannot get offset of passive segment initialized multiple times");
      Fatal::~Fatal(&local_1c0);
    }
    a = wasm::Literal::getUnsigned((Literal *)&add->op);
    this_00 = std::
              unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
              ::operator[](*(unordered_map<wasm::Name,_wasm::Address,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Address>_>_>
                             **)((long)this + 0xd8),(key_type *)&dest->value);
    wasm::Address::operator=(this_00,a);
  }
  return;
}

Assistant:

void visitMemoryInit(MemoryInit* curr) {
        // The desitination of the memory.init is either a constant
        // or the result of an addition with __memory_base in the
        // case of PIC code.
        auto* dest = curr->dest->dynCast<Const>();
        if (!dest) {
          auto* add = curr->dest->dynCast<Binary>();
          if (!add) {
            return;
          }
          dest = add->left->dynCast<Const>();
          if (!dest) {
            return;
          }
        }
        if (offsets.find(curr->segment) != offsets.end()) {
          Fatal() << "Cannot get offset of passive segment initialized "
                     "multiple times";
        }
        offsets[curr->segment] = dest->value.getUnsigned();
      }